

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool PrngTest<Blob<128>>(hashfunc<Blob<128>_> hash,bool testColl,bool testDist,bool drawDiagram)

{
  bool bVar1;
  undefined1 in_CL;
  undefined1 in_DL;
  undefined1 in_SIL;
  bool result;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  bool in_stack_000000ab;
  bool in_stack_000000ac;
  bool in_stack_000000ad;
  bool in_stack_000000ae;
  bool in_stack_000000af;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_000000b0;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffffd0;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffffe0;
  pfHash in_stack_ffffffffffffffe8;
  undefined3 in_stack_fffffffffffffff4;
  uint uVar2;
  hashfunc local_8 [8];
  
  uVar2 = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  uVar2 = CONCAT13((char)(uVar2 >> 0x18),CONCAT12(in_DL,(short)uVar2)) & 0xff01ffff;
  uVar2 = CONCAT22((short)(uVar2 >> 0x10),CONCAT11(in_CL,(char)uVar2)) & 0xffff01ff;
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x163ac3);
  hashfunc::operator_cast_to_function_pointer(local_8);
  Prn_gen<Blob<128>>(uVar2,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  bVar1 = TestHashList<Blob<128>>
                    (in_stack_000000b0,in_stack_000000af,in_stack_000000ae,in_stack_000000ad,
                     in_stack_000000ac,in_stack_000000ab);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector(in_stack_ffffffffffffffd0);
  return bVar1;
}

Assistant:

bool PrngTest ( hashfunc<hashtype> hash,
                bool testColl, bool testDist, bool drawDiagram )
{

  if (sizeof(hashtype) < 8) {
      printf("The PRNG test is designed for hashes >= 64-bit \n");
      return true;
  }

  //----------

  std::vector<hashtype> hashes;
  Prn_gen(32 << 20, hash, hashes);

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  return result;
}